

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O2

int rfc7181_metric_encode(rfc7181_metric_field *encoded,uint32_t decoded)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint uVar3;
  
  if (decoded - 0xffffff < 0xff000002) {
    return -1;
  }
  if (decoded < 0xffff01) {
    uVar1 = '\0';
    for (uVar3 = decoded + 0x100; 0x200 < uVar3; uVar3 = uVar3 + 1 >> 1) {
      uVar1 = uVar1 + '\x01';
    }
    uVar2 = (char)uVar3 + 0xff;
  }
  else {
    uVar2 = 0xff;
    uVar1 = '\x0f';
  }
  encoded->b[0] = uVar1;
  encoded->b[1] = uVar2;
  return 0;
}

Assistant:

int
rfc7181_metric_encode(struct rfc7181_metric_field *encoded, uint32_t decoded) {
  uint8_t a, b;
  /*
   * metric-value := (257+b)2^a - 256
   * metric-code := 256 * a + b
   */

  if (decoded < RFC7181_METRIC_MIN || decoded >= RFC7181_METRIC_INFINITE) {
    return -1;
  }
  if (decoded > RFC7181_METRIC_MAX) {
    encoded->b[0] = 0x0f;
    encoded->b[1] = 0xff;
    return 0;
  }

  /* metric-value + 256 = (257+b)<<a */
  decoded += 256;

  a = 0;
  while (decoded > 512) {
    a++;

    /* divide by 2 and round up */
    decoded++;
    decoded >>= 1;
  }

  b = decoded - 257;

  encoded->b[0] = a;
  encoded->b[1] = b;

  return 0;
}